

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> * __thiscall
TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_>::get_node
          (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *this,uint index)

{
  pointer ppvVar1;
  ulong uVar2;
  
  uVar2 = (ulong)index;
  ppvVar1 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((uVar2 < (ulong)((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar1 >> 3)) &&
     (((ulong)ppvVar1[uVar2] & 1) != 0)) {
    return (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *)
           ((long)ppvVar1[uVar2] + -1);
  }
  __assert_fail("is_trie(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                ,0x3a,
                "TrieNode<CharT, BucketT> *TrieNode<unsigned char, vector_block<unsigned char *>>::get_node(unsigned int) const [CharT = unsigned char, BucketT = vector_block<unsigned char *>]"
               );
}

Assistant:

bool is_trie(unsigned index) const
	{
		static_assert(sizeof(size_t)==sizeof(void*),
			"size_t and void* size must match");
		if (index < _buckets.size()) {return size_t(_buckets[index])&1;}
		return false;
	}